

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Command::single_match(Command *this,PatternList *left)

{
  byte bVar1;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  LeafPattern *__args_1;
  string *psVar2;
  value *this_01;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_RDX;
  long *in_RSI;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *in_RDI;
  Argument *arg;
  size_t size;
  size_t i;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *ret;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  value *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  value *in_stack_ffffffffffffff00;
  string local_80 [72];
  LeafPattern *local_38;
  ulong local_30;
  ulong local_28;
  undefined1 local_19;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_>::
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>,_true>
            ((pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)0x1bf7e6);
  local_28 = 0;
  local_30 = std::
             vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ::size(local_18);
  while( true ) {
    if (local_30 <= local_28) {
      return in_RDI;
    }
    this_00 = &std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::operator[](local_18,local_28)->
               super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>;
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    if (__args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      __args_1 = (LeafPattern *)0x0;
    }
    else {
      __args_1 = (LeafPattern *)__dynamic_cast(__args,&Pattern::typeinfo,&Argument::typeinfo,0);
    }
    if (__args_1 != (LeafPattern *)0x0) break;
    local_28 = local_28 + 1;
    local_38 = (LeafPattern *)0x0;
  }
  local_38 = __args_1;
  psVar2 = (string *)(**(code **)(*in_RSI + 0x18))();
  std::__cxx11::string::string(local_80,psVar2);
  value::value(in_stack_ffffffffffffff00,
               (string *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  LeafPattern::getValue(local_38);
  bVar1 = docopt::operator==((value *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                             in_stack_fffffffffffffef0);
  value::~value(in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(local_80);
  if ((bVar1 & 1) == 0) {
    return in_RDI;
  }
  in_RDI->first = local_28;
  this_01 = (value *)(**(code **)(*in_RSI + 0x18))();
  value::value(this_01,(bool)in_stack_fffffffffffffeef);
  std::make_shared<docopt::Command,std::__cxx11::string_const&,docopt::value>
            (__args,(value *)__args_1);
  std::shared_ptr<docopt::LeafPattern>::operator=
            ((shared_ptr<docopt::LeafPattern> *)this_01,
             (shared_ptr<docopt::Command> *)
             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  std::shared_ptr<docopt::Command>::~shared_ptr((shared_ptr<docopt::Command> *)0x1bf989);
  value::~value(this_01);
  return in_RDI;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Command::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				if (name() == arg->getValue()) {
					ret.first = i;
					ret.second = std::make_shared<Command>(name(), value{true});
				}
				break;
			}
		}

		return ret;
	}